

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getOverflowPage(BtShared *pBt,Pgno ovfl,MemPage **ppPage,Pgno *pPgnoNext)

{
  uint uVar1;
  Pgno PVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Pgno key;
  Pgno PVar6;
  u8 eType;
  MemPage *pPage;
  Pgno pgno;
  u8 local_49;
  MemPage *local_48;
  Pgno local_3c;
  Pgno *local_38;
  
  local_48 = (MemPage *)0x0;
  uVar5 = ovfl;
  if (pBt->autoVacuum == '\0') {
    PVar6 = 0;
    PVar2 = 0;
  }
  else {
    do {
      uVar4 = uVar5;
      uVar5 = uVar4 + 1;
      uVar1 = 0;
      if (1 < uVar5) {
        iVar3 = (uVar4 - 1) - (uVar4 - 1) % (pBt->usableSize / 5 + 1);
        uVar1 = iVar3 + (uint)(iVar3 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
    } while ((uVar5 == uVar1) || (uVar4 == (uint)sqlite3PendingByte / pBt->pageSize));
    key = uVar4 + 1;
    PVar6 = 0;
    local_38 = pPgnoNext;
    if (pBt->nPage < key) {
      PVar2 = 0;
    }
    else {
      PVar2 = ptrmapGet(pBt,key,&local_49,&local_3c);
      pPgnoNext = local_38;
      if ((PVar2 == 0) && (local_49 == '\x04')) {
        PVar6 = key;
        if (local_3c != ovfl) {
          PVar6 = 0;
        }
        PVar2 = 0x65;
        if (local_3c != ovfl) {
          PVar2 = 0;
        }
      }
    }
  }
  if ((PVar2 == 0) &&
     (PVar2 = btreeGetPage(pBt,ovfl,&local_48,(uint)(ppPage == (MemPage **)0x0) * 2), PVar2 == 0)) {
    uVar5 = *(uint *)local_48->aData;
    PVar6 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    PVar2 = 0;
  }
  *pPgnoNext = PVar6;
  if (ppPage == (MemPage **)0x0) {
    if (local_48 != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_48->pDbPage);
    }
  }
  else {
    *ppPage = local_48;
  }
  PVar6 = 0;
  if (PVar2 != 0x65) {
    PVar6 = PVar2;
  }
  return PVar6;
}

Assistant:

static int getOverflowPage(
  BtShared *pBt,               /* The database file */
  Pgno ovfl,                   /* Current overflow page number */
  MemPage **ppPage,            /* OUT: MemPage handle (may be NULL) */
  Pgno *pPgnoNext              /* OUT: Next overflow page number */
){
  Pgno next = 0;
  MemPage *pPage = 0;
  int rc = SQLITE_OK;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert(pPgnoNext);

#ifndef SQLITE_OMIT_AUTOVACUUM
  /* Try to find the next page in the overflow list using the
  ** autovacuum pointer-map pages. Guess that the next page in
  ** the overflow list is page number (ovfl+1). If that guess turns
  ** out to be wrong, fall back to loading the data of page
  ** number ovfl to determine the next page number.
  */
  if( pBt->autoVacuum ){
    Pgno pgno;
    Pgno iGuess = ovfl+1;
    u8 eType;

    while( PTRMAP_ISPAGE(pBt, iGuess) || iGuess==PENDING_BYTE_PAGE(pBt) ){
      iGuess++;
    }

    if( iGuess<=btreePagecount(pBt) ){
      rc = ptrmapGet(pBt, iGuess, &eType, &pgno);
      if( rc==SQLITE_OK && eType==PTRMAP_OVERFLOW2 && pgno==ovfl ){
        next = iGuess;
        rc = SQLITE_DONE;
      }
    }
  }
#endif

  assert( next==0 || rc==SQLITE_DONE );
  if( rc==SQLITE_OK ){
    rc = btreeGetPage(pBt, ovfl, &pPage, (ppPage==0) ? PAGER_GET_READONLY : 0);
    assert( rc==SQLITE_OK || pPage==0 );
    if( rc==SQLITE_OK ){
      next = get4byte(pPage->aData);
    }
  }

  *pPgnoNext = next;
  if( ppPage ){
    *ppPage = pPage;
  }else{
    releasePage(pPage);
  }
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}